

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasuEigen.cpp
# Opt level: O2

void test_Eigen<_1,_1>(int M)

{
  Scalar *pSVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int j;
  ulong col;
  bool bVar7;
  double dVar8;
  double r;
  MatType aa;
  double y;
  double x;
  Scalar local_60;
  PlainObjectBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> local_58;
  double local_40;
  double local_38;
  
  local_58.m_storage.m_cols = 0;
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  uVar5 = M + 1;
  Eigen::PlainObjectBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_58,(long)(int)uVar5,(long)(int)uVar5);
  local_60 = 0.0;
  Eigen::DenseBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>::setConstant
            ((DenseBase<Eigen::Array<double,__1,__1,_0,__1,__1>_> *)&local_58,&local_60);
  for (lVar4 = 0; lVar4 <= M; lVar4 = lVar4 + 1) {
    for (col = 0; uVar5 != col; col = col + 1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,__1,_0,__1,__1>,_1> *)&local_58,
                          lVar4,col);
      *pSVar1 = (double)((int)lVar4 + (int)col);
    }
  }
  local_60 = 0.0;
  local_38 = 0.1;
  local_40 = 0.7;
  iVar6 = 1000000;
  lVar4 = std::chrono::_V2::system_clock::now();
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    dVar8 = Clenshaw2DEigen<Eigen::Array<double,_1,_1,0,_1,_1>>
                      ((Array<double,__1,__1,_0,__1,__1> *)&local_58,local_38,local_40);
    local_60 = dVar8 + local_60;
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>
                     ((((double)(lVar2 - lVar4) / 1000000000.0) / 1000000.0) * 1000000.0);
  std::operator<<(poVar3," us/call. (Eigen-powered) value:");
  poVar3 = std::ostream::_M_insert<double>(local_60 / 1000000.0);
  std::endl<char,std::char_traits<char>>(poVar3);
  free(local_58.m_storage.m_data);
  return;
}

Assistant:

void test_Eigen(int M){
    using MatType = Eigen::Array<double, Rows, Cols>;
    MatType aa; 
    if constexpr ((Rows < 0) || (Cols < 0)) {
        aa.resize(M + 1, M + 1);
    }
    else{
        aa.resize(M + 1, M + 1);
    }
    aa.fill(0.0);
    for (auto i = 0; i < M + 1; ++i) {
        for (auto j = 0; j < M + 1; ++j) {
            aa(i, j) = i + j;
        }
    }
    int N = 1000 * 1000;
    volatile auto r = 0.0, x = 0.1, y = 0.7;
    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        auto v = Clenshaw2DEigen(aa, x, y);
        r += v;
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N * 1e6;
    std::cout << elap_us << " us/call. (Eigen-powered) value:" << (r / N) << std::endl;
}